

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

void __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::joinString
          (Interpreter *this,bool *first,UString *running,Value *sep,uint idx,Value *elt)

{
  ostream *poVar1;
  LocationRange *loc;
  Frame *pFVar2;
  byte *in_RSI;
  uint in_R8D;
  int *in_R9;
  stringstream ss;
  string *in_stack_fffffffffffffdb8;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
  *in_stack_fffffffffffffdc8;
  Interpreter *this_00;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
  *in_stack_fffffffffffffdd0;
  string local_1e8 [48];
  stringstream local_1b8 [16];
  ostream local_1a8 [388];
  uint local_24;
  byte *local_10;
  
  if (*in_R9 != 0) {
    if (*in_R9 != 0x13) {
      local_24 = in_R8D;
      std::__cxx11::stringstream::stringstream(local_1b8);
      poVar1 = std::operator<<(local_1a8,"expected string but arr[");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_24);
      poVar1 = std::operator<<(poVar1,"] was ");
      (anonymous_namespace)::type_str_abi_cxx11_((Value *)in_stack_fffffffffffffdb8);
      std::operator<<(poVar1,local_1e8);
      std::__cxx11::string::~string(local_1e8);
      loc = (LocationRange *)__cxa_allocate_exception(0x38);
      pFVar2 = Stack::top((Stack *)0x2ab710);
      this_00 = (Interpreter *)&pFVar2->location;
      std::__cxx11::stringstream::str();
      makeError(this_00,loc,in_stack_fffffffffffffdb8);
      __cxa_throw(loc,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
    }
    local_10 = in_RSI;
    if ((*in_RSI & 1) == 0) {
      std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
      append(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
    }
    *local_10 = 0;
    std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
    append(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
  }
  return;
}

Assistant:

void joinString(bool &first, UString &running, const Value &sep, unsigned idx, const Value &elt)
    {
        if (elt.t == Value::NULL_TYPE) {
            return;
        }
        if (elt.t != Value::STRING) {
            std::stringstream ss;
            ss << "expected string but arr[" << idx << "] was " << type_str(elt);
            throw makeError(stack.top().location, ss.str());
        }
        if (!first) {
            running.append(static_cast<HeapString *>(sep.v.h)->value);
        }
        first = false;
        running.append(static_cast<HeapString *>(elt.v.h)->value);
    }